

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O2

Gia_Man_t * Gia_ManReadMiniAig(char *pFileName)

{
  Mini_Aig_t *p;
  Gia_Man_t *pGVar1;
  char *pcVar2;
  
  p = Mini_AigLoad(pFileName);
  pGVar1 = Gia_ManFromMiniAig(p,(Vec_Int_t **)0x0);
  if (pGVar1->pName != (char *)0x0) {
    free(pGVar1->pName);
    pGVar1->pName = (char *)0x0;
  }
  pcVar2 = Extra_FileNameGeneric(pFileName);
  pGVar1->pName = pcVar2;
  Mini_AigStop(p);
  return pGVar1;
}

Assistant:

Gia_Man_t * Gia_ManReadMiniAig( char * pFileName )
{
    Mini_Aig_t * p = Mini_AigLoad( pFileName );
    Gia_Man_t * pGia = Gia_ManFromMiniAig( p, NULL );
    ABC_FREE( pGia->pName );
    pGia->pName = Extra_FileNameGeneric( pFileName ); 
    Mini_AigStop( p );
    return pGia;
}